

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.h
# Opt level: O1

void __thiscall
csguide_webserver::Logger::Log<char_const*,char_const*,char_const*>
          (Logger *this,LogLevel level,string *fmt_str,char *args,char *args_1,char *args_2)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *__s;
  long *plVar2;
  ostream *poVar3;
  long *plVar4;
  size_type *psVar5;
  string formatted_msg;
  string message;
  string local_a8;
  long *local_88;
  long local_80;
  long local_78;
  long lStack_70;
  undefined1 *local_68 [2];
  undefined1 local_58 [16];
  string local_48;
  
  std::__cxx11::string::string
            ((string *)&local_a8,(fmt_str->_M_dataplus)._M_p,(allocator *)&local_88);
  FormatMessage(&local_48,this,&local_a8,args,args_1,args_2);
  paVar1 = &local_a8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  __s = LogLevelToString(this,level);
  local_68[0] = local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_68,": ","");
  strlen(__s);
  plVar2 = (long *)std::__cxx11::string::replace((ulong)local_68,0,(char *)0x0,(ulong)__s);
  plVar4 = plVar2 + 2;
  if ((long *)*plVar2 == plVar4) {
    local_78 = *plVar4;
    lStack_70 = plVar2[3];
    local_88 = &local_78;
  }
  else {
    local_78 = *plVar4;
    local_88 = (long *)*plVar2;
  }
  local_80 = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_88,(ulong)local_48._M_dataplus._M_p);
  psVar5 = (size_type *)(plVar2 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar2 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar5) {
    local_a8.field_2._M_allocated_capacity = *psVar5;
    local_a8.field_2._8_8_ = plVar2[3];
    local_a8._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_a8.field_2._M_allocated_capacity = *psVar5;
    local_a8._M_dataplus._M_p = (pointer)*plVar2;
  }
  local_a8._M_string_length = plVar2[1];
  *plVar2 = (long)psVar5;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if (local_88 != &local_78) {
    operator_delete(local_88);
  }
  if (local_68[0] != local_58) {
    operator_delete(local_68[0]);
  }
  if (this->use_file_ == true) {
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)this,local_a8._M_dataplus._M_p,local_a8._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  }
  else {
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,local_a8._M_dataplus._M_p,local_a8._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  }
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  return;
}

Assistant:

void Logger::Log(LogLevel level, const std::string& fmt_str, Args... args) {
  std::string message = FormatMessage(fmt_str.c_str(), args...);
  std::string formatted_msg = LogLevelToString(level) + std::string(": ") + message;

  if (use_file_) {
    log_file_ << formatted_msg << std::endl;
  } else {
    std::cout << formatted_msg << std::endl;
  }
}